

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O1

ON_BoundingBox * __thiscall
ON_BrepFace::InternalFaceBoundingBox
          (ON_BoundingBox *__return_storage_ptr__,ON_BrepFace *this,bool bLazy,
          bool bUpdateCachedBBox)

{
  double dVar1;
  double dVar2;
  uint uVar3;
  ON_Brep *pOVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  bool bVar8;
  int iVar9;
  ON_BrepFace *this_00;
  long lVar10;
  ON_3dPoint *pOVar11;
  undefined4 extraout_var;
  undefined7 in_register_00000011;
  long lVar12;
  ON_BrepLoop *this_02;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  ON_Interval pudom;
  ON_Interval pvdom;
  ON_BoundingBox pbox;
  ON_Interval local_a8;
  ON_Interval local_98;
  ON_BoundingBox local_88;
  ON_Interval local_58;
  ON_Interval local_48;
  ON_Geometry *this_01;
  
  if ((int)CONCAT71(in_register_00000011,bLazy) != 0) {
    bVar8 = ON_BoundingBox::IsNotEmpty(&this->m_bbox);
    if (bVar8) {
      uVar13 = *(undefined4 *)&(this->m_bbox).m_min.x;
      uVar14 = *(undefined4 *)((long)&(this->m_bbox).m_min.x + 4);
      uVar15 = *(undefined4 *)&(this->m_bbox).m_min.y;
      uVar16 = *(undefined4 *)((long)&(this->m_bbox).m_min.y + 4);
      uVar17 = *(undefined4 *)&(this->m_bbox).m_min.z;
      uVar18 = *(undefined4 *)((long)&(this->m_bbox).m_min.z + 4);
      uVar19 = *(undefined4 *)&(this->m_bbox).m_max.x;
      uVar20 = *(undefined4 *)((long)&(this->m_bbox).m_max.x + 4);
      uVar21 = *(undefined4 *)&(this->m_bbox).m_max.y;
      uVar22 = *(undefined4 *)((long)&(this->m_bbox).m_max.y + 4);
      uVar23 = *(undefined4 *)&(this->m_bbox).m_max.z;
      uVar24 = *(undefined4 *)((long)&(this->m_bbox).m_max.z + 4);
      goto LAB_003f6933;
    }
  }
  pOVar4 = this->m_brep;
  uVar13 = ON_BoundingBox::EmptyBoundingBox.m_min.x._0_4_;
  uVar14 = ON_BoundingBox::EmptyBoundingBox.m_min.x._4_4_;
  uVar15 = ON_BoundingBox::EmptyBoundingBox.m_min.y._0_4_;
  uVar16 = ON_BoundingBox::EmptyBoundingBox.m_min.y._4_4_;
  uVar17 = ON_BoundingBox::EmptyBoundingBox.m_min.z._0_4_;
  uVar18 = ON_BoundingBox::EmptyBoundingBox.m_min.z._4_4_;
  uVar19 = ON_BoundingBox::EmptyBoundingBox.m_max.x._0_4_;
  uVar20 = ON_BoundingBox::EmptyBoundingBox.m_max.x._4_4_;
  uVar21 = ON_BoundingBox::EmptyBoundingBox.m_max.y._0_4_;
  uVar22 = ON_BoundingBox::EmptyBoundingBox.m_max.y._4_4_;
  uVar23 = ON_BoundingBox::EmptyBoundingBox.m_max.z._0_4_;
  uVar24 = ON_BoundingBox::EmptyBoundingBox.m_max.z._4_4_;
  if (pOVar4 == (ON_Brep *)0x0) goto LAB_003f6933;
  iVar9 = this->m_face_index;
  if (((((long)iVar9 < 0) ||
       ((pOVar4->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.m_count <=
        iVar9)) ||
      ((pOVar4->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.m_a + iVar9
       != this)) ||
     (this_00 = (ON_BrepFace *)ON_SurfaceProxy::ProxySurface(&this->super_ON_SurfaceProxy),
     uVar13 = ON_BoundingBox::EmptyBoundingBox.m_min.x._0_4_,
     uVar14 = ON_BoundingBox::EmptyBoundingBox.m_min.x._4_4_,
     uVar15 = ON_BoundingBox::EmptyBoundingBox.m_min.y._0_4_,
     uVar16 = ON_BoundingBox::EmptyBoundingBox.m_min.y._4_4_,
     uVar17 = ON_BoundingBox::EmptyBoundingBox.m_min.z._0_4_,
     uVar18 = ON_BoundingBox::EmptyBoundingBox.m_min.z._4_4_,
     uVar19 = ON_BoundingBox::EmptyBoundingBox.m_max.x._0_4_,
     uVar20 = ON_BoundingBox::EmptyBoundingBox.m_max.x._4_4_,
     uVar21 = ON_BoundingBox::EmptyBoundingBox.m_max.y._0_4_,
     uVar22 = ON_BoundingBox::EmptyBoundingBox.m_max.y._4_4_,
     uVar23 = ON_BoundingBox::EmptyBoundingBox.m_max.z._0_4_,
     uVar24 = ON_BoundingBox::EmptyBoundingBox.m_max.z._4_4_,
     this_00 == this || this_00 == (ON_BrepFace *)0x0)) goto LAB_003f6933;
  local_88.m_max.y =
       (double)CONCAT44(ON_BoundingBox::NanBoundingBox.m_max.y._4_4_,
                        ON_BoundingBox::NanBoundingBox.m_max.y._0_4_);
  local_88.m_max.z =
       (double)CONCAT44(ON_BoundingBox::NanBoundingBox.m_max.z._4_4_,
                        ON_BoundingBox::NanBoundingBox.m_max.z._0_4_);
  local_88.m_min.z =
       (double)CONCAT44(ON_BoundingBox::NanBoundingBox.m_min.z._4_4_,
                        ON_BoundingBox::NanBoundingBox.m_min.z._0_4_);
  local_88.m_max.x =
       (double)CONCAT44(ON_BoundingBox::NanBoundingBox.m_max.x._4_4_,
                        ON_BoundingBox::NanBoundingBox.m_max.x._0_4_);
  local_88.m_min.x =
       (double)CONCAT44(ON_BoundingBox::NanBoundingBox.m_min.x._4_4_,
                        ON_BoundingBox::NanBoundingBox.m_min.x._0_4_);
  local_88.m_min.y =
       (double)CONCAT44(ON_BoundingBox::NanBoundingBox.m_min.y._4_4_,
                        ON_BoundingBox::NanBoundingBox.m_min.y._0_4_);
  lVar10 = (long)(this->m_li).m_count;
  if (0 < lVar10) {
    pOVar4 = this->m_brep;
    lVar12 = 0;
    do {
      if (pOVar4 == (ON_Brep *)0x0) {
        this_02 = (ON_BrepLoop *)0x0;
      }
      else {
        uVar3 = (this->m_li).m_a[lVar12];
        this_02 = (pOVar4->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.
                  m_a + uVar3;
        if ((pOVar4->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.m_count
            <= (int)uVar3) {
          this_02 = (ON_BrepLoop *)0x0;
        }
        if ((int)uVar3 < 0) {
          this_02 = (ON_BrepLoop *)0x0;
        }
      }
      if ((this_02 != (ON_BrepLoop *)0x0) && (this_02->m_type == outer)) {
        (*(pOVar4->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x27])(pOVar4,this_02,1);
        bVar8 = ON_BoundingBox::IsValid(&local_88);
        bVar8 = ON_Geometry::GetBoundingBox(&this_02->super_ON_Geometry,&local_88,bVar8);
        if (!bVar8) {
          local_88.m_max.y = ON_BoundingBox::UnsetBoundingBox.m_max.y;
          local_88.m_max.z = ON_BoundingBox::UnsetBoundingBox.m_max.z;
          local_88.m_min.z = ON_BoundingBox::UnsetBoundingBox.m_min.z;
          local_88.m_max.x = ON_BoundingBox::UnsetBoundingBox.m_max.x;
          local_88.m_min.x = ON_BoundingBox::UnsetBoundingBox.m_min.x;
          local_88.m_min.y = ON_BoundingBox::UnsetBoundingBox.m_min.y;
        }
        break;
      }
      lVar12 = lVar12 + 1;
    } while (lVar10 != lVar12);
  }
  dVar1 = (double)CONCAT44(ON_BoundingBox::NanBoundingBox.m_min.x._4_4_,
                           ON_BoundingBox::NanBoundingBox.m_min.x._0_4_);
  dVar2 = (double)CONCAT44(ON_BoundingBox::NanBoundingBox.m_min.y._4_4_,
                           ON_BoundingBox::NanBoundingBox.m_min.y._0_4_);
  dVar5 = (double)CONCAT44(ON_BoundingBox::NanBoundingBox.m_min.z._4_4_,
                           ON_BoundingBox::NanBoundingBox.m_min.z._0_4_);
  dVar6 = (double)CONCAT44(ON_BoundingBox::NanBoundingBox.m_max.x._4_4_,
                           ON_BoundingBox::NanBoundingBox.m_max.x._0_4_);
  dVar7 = (double)CONCAT44(ON_BoundingBox::NanBoundingBox.m_max.z._4_4_,
                           ON_BoundingBox::NanBoundingBox.m_max.z._0_4_);
  (__return_storage_ptr__->m_max).y =
       (double)CONCAT44(ON_BoundingBox::NanBoundingBox.m_max.y._4_4_,
                        ON_BoundingBox::NanBoundingBox.m_max.y._0_4_);
  (__return_storage_ptr__->m_max).z = dVar7;
  (__return_storage_ptr__->m_min).z = dVar5;
  (__return_storage_ptr__->m_max).x = dVar6;
  (__return_storage_ptr__->m_min).x = dVar1;
  (__return_storage_ptr__->m_min).y = dVar2;
  bVar8 = ON_BoundingBox::IsNotEmpty(&local_88);
  if (bVar8) {
    pOVar11 = ON_BoundingBox::operator[](&local_88,0);
    dVar1 = pOVar11->x;
    pOVar11 = ON_BoundingBox::operator[](&local_88,1);
    ON_Interval::ON_Interval(&local_a8,dVar1,pOVar11->x);
    pOVar11 = ON_BoundingBox::operator[](&local_88,0);
    dVar1 = pOVar11->y;
    pOVar11 = ON_BoundingBox::operator[](&local_88,1);
    dVar2 = pOVar11->y;
    uVar13 = SUB84(dVar2,0);
    uVar14 = (undefined4)((ulong)dVar2 >> 0x20);
    ON_Interval::ON_Interval(&local_98,dVar1,dVar2);
    dVar1 = ON_Interval::Length(&local_a8);
    ON_Interval::Expand(&local_a8,dVar1 * 0.1);
    dVar1 = ON_Interval::Length(&local_98);
    ON_Interval::Expand(&local_98,dVar1 * 0.1);
    (*(this->super_ON_SurfaceProxy).super_ON_Surface.super_ON_Geometry.super_ON_Object.
      _vptr_ON_Object[0x26])(this,0);
    local_58.m_t[1] = (double)CONCAT44(uVar14,uVar13);
    (*(this->super_ON_SurfaceProxy).super_ON_Surface.super_ON_Geometry.super_ON_Object.
      _vptr_ON_Object[0x26])(this,1);
    local_48.m_t[1] = (double)CONCAT44(uVar14,uVar13);
    ON_Interval::Intersection(&local_a8,&local_58);
    ON_Interval::Intersection(&local_98,&local_48);
    bVar8 = ON_BoundingBox::IsValid(&local_88);
    if ((bVar8) &&
       ((bVar8 = ON_Interval::Includes(&local_58,&local_a8,true), bVar8 ||
        (bVar8 = ON_Interval::Includes(&local_48,&local_98,true), bVar8)))) {
      iVar9 = (*(this->super_ON_SurfaceProxy).super_ON_Surface.super_ON_Geometry.super_ON_Object.
                _vptr_ON_Object[0x24])(this);
      this_01 = (ON_Geometry *)CONCAT44(extraout_var,iVar9);
      if (this_01 != (ON_Geometry *)0x0) {
        bVar8 = ON_Interval::Includes(&local_58,&local_a8,true);
        if (bVar8) {
          (*(this_01->super_ON_Object)._vptr_ON_Object[0x39])(this_01,0,&local_a8);
        }
        bVar8 = ON_Interval::Includes(&local_48,&local_98,true);
        if (bVar8) {
          (*(this_01->super_ON_Object)._vptr_ON_Object[0x39])(this_01,1,&local_98);
        }
        bVar8 = ON_Geometry::GetBoundingBox(this_01,__return_storage_ptr__,false);
        uVar16 = ON_BoundingBox::NanBoundingBox.m_min.y._4_4_;
        uVar15 = ON_BoundingBox::NanBoundingBox.m_min.y._0_4_;
        uVar14 = ON_BoundingBox::NanBoundingBox.m_min.x._4_4_;
        uVar13 = ON_BoundingBox::NanBoundingBox.m_min.x._0_4_;
        if (!bVar8) {
          dVar1 = (double)CONCAT44(ON_BoundingBox::NanBoundingBox.m_min.z._4_4_,
                                   ON_BoundingBox::NanBoundingBox.m_min.z._0_4_);
          dVar2 = (double)CONCAT44(ON_BoundingBox::NanBoundingBox.m_max.x._4_4_,
                                   ON_BoundingBox::NanBoundingBox.m_max.x._0_4_);
          dVar5 = (double)CONCAT44(ON_BoundingBox::NanBoundingBox.m_max.z._4_4_,
                                   ON_BoundingBox::NanBoundingBox.m_max.z._0_4_);
          (__return_storage_ptr__->m_max).y =
               (double)CONCAT44(ON_BoundingBox::NanBoundingBox.m_max.y._4_4_,
                                ON_BoundingBox::NanBoundingBox.m_max.y._0_4_);
          (__return_storage_ptr__->m_max).z = dVar5;
          (__return_storage_ptr__->m_min).z = dVar1;
          (__return_storage_ptr__->m_max).x = dVar2;
          *(undefined4 *)&(__return_storage_ptr__->m_min).x = uVar13;
          *(undefined4 *)((long)&(__return_storage_ptr__->m_min).x + 4) = uVar14;
          *(undefined4 *)&(__return_storage_ptr__->m_min).y = uVar15;
          *(undefined4 *)((long)&(__return_storage_ptr__->m_min).y + 4) = uVar16;
        }
        (*(this_01->super_ON_Object)._vptr_ON_Object[4])(this_01);
      }
    }
  }
  bVar8 = ON_BoundingBox::IsNotEmpty(__return_storage_ptr__);
  if (bVar8) {
    iVar9 = 1;
    if (bUpdateCachedBBox) {
LAB_003f68eb:
      dVar1 = (__return_storage_ptr__->m_min).x;
      dVar2 = (__return_storage_ptr__->m_min).y;
      dVar5 = (__return_storage_ptr__->m_min).z;
      dVar6 = (__return_storage_ptr__->m_max).x;
      dVar7 = (__return_storage_ptr__->m_max).z;
      (this->m_bbox).m_max.y = (__return_storage_ptr__->m_max).y;
      (this->m_bbox).m_max.z = dVar7;
      (this->m_bbox).m_min.z = dVar5;
      (this->m_bbox).m_max.x = dVar6;
      (this->m_bbox).m_min.x = dVar1;
      (this->m_bbox).m_min.y = dVar2;
      iVar9 = 1;
    }
  }
  else {
    bVar8 = ON_Geometry::GetBoundingBox((ON_Geometry *)this_00,__return_storage_ptr__,false);
    iVar9 = 2;
    if (bVar8) {
      bVar8 = ON_BoundingBox::IsNotEmpty(__return_storage_ptr__);
      if (bVar8 && bUpdateCachedBBox) goto LAB_003f68eb;
      iVar9 = 2 - (uint)bVar8;
    }
  }
  uVar13 = ON_BoundingBox::EmptyBoundingBox.m_min.x._0_4_;
  uVar14 = ON_BoundingBox::EmptyBoundingBox.m_min.x._4_4_;
  uVar15 = ON_BoundingBox::EmptyBoundingBox.m_min.y._0_4_;
  uVar16 = ON_BoundingBox::EmptyBoundingBox.m_min.y._4_4_;
  uVar17 = ON_BoundingBox::EmptyBoundingBox.m_min.z._0_4_;
  uVar18 = ON_BoundingBox::EmptyBoundingBox.m_min.z._4_4_;
  uVar19 = ON_BoundingBox::EmptyBoundingBox.m_max.x._0_4_;
  uVar20 = ON_BoundingBox::EmptyBoundingBox.m_max.x._4_4_;
  uVar21 = ON_BoundingBox::EmptyBoundingBox.m_max.y._0_4_;
  uVar22 = ON_BoundingBox::EmptyBoundingBox.m_max.y._4_4_;
  uVar23 = ON_BoundingBox::EmptyBoundingBox.m_max.z._0_4_;
  uVar24 = ON_BoundingBox::EmptyBoundingBox.m_max.z._4_4_;
  if (iVar9 != 2) {
    return __return_storage_ptr__;
  }
LAB_003f6933:
  *(undefined4 *)&(__return_storage_ptr__->m_max).y = uVar21;
  *(undefined4 *)((long)&(__return_storage_ptr__->m_max).y + 4) = uVar22;
  *(undefined4 *)&(__return_storage_ptr__->m_max).z = uVar23;
  *(undefined4 *)((long)&(__return_storage_ptr__->m_max).z + 4) = uVar24;
  *(undefined4 *)&(__return_storage_ptr__->m_min).z = uVar17;
  *(undefined4 *)((long)&(__return_storage_ptr__->m_min).z + 4) = uVar18;
  *(undefined4 *)&(__return_storage_ptr__->m_max).x = uVar19;
  *(undefined4 *)((long)&(__return_storage_ptr__->m_max).x + 4) = uVar20;
  *(undefined4 *)&(__return_storage_ptr__->m_min).x = uVar13;
  *(undefined4 *)((long)&(__return_storage_ptr__->m_min).x + 4) = uVar14;
  *(undefined4 *)&(__return_storage_ptr__->m_min).y = uVar15;
  *(undefined4 *)((long)&(__return_storage_ptr__->m_min).y + 4) = uVar16;
  return __return_storage_ptr__;
}

Assistant:

const ON_BoundingBox ON_BrepFace::InternalFaceBoundingBox(bool bLazy, bool bUpdateCachedBBox) const
{
  if (bLazy && m_bbox.IsNotEmpty())
    return m_bbox;

  for (;;)
  {
    // Make sure this face is valid enough to query the trims and proxy surface
    if (nullptr == m_brep)
      break;
    if (m_face_index < 0)
      break;
    if (m_face_index >= m_brep->m_F.Count())
      break;
    if (&m_brep->m_F[m_face_index] != this)
      break;

    const ON_Surface* proxy_srf = ProxySurface();
    if (nullptr == proxy_srf)
      break;
    if (proxy_srf == this)
      break;

    ON_BoundingBox pbox = ON_BoundingBox::NanBoundingBox;
    for (int li = 0; li < LoopCount(); li++)
    {
      ON_BrepLoop* loop = Loop(li);
      if (loop && loop->m_type == ON_BrepLoop::outer)
      {
        m_brep->SetTrimBoundingBoxes(*loop, true);       // sets loop->m_pbox 
        if (false == loop->GetBoundingBox(pbox, pbox.IsValid()))
          pbox = ON_BoundingBox::UnsetBoundingBox;
        break;
      }
    }


    ON_BoundingBox face_bbox = ON_BoundingBox::NanBoundingBox;
    if (pbox.IsNotEmpty())
    {
      ON_Interval pudom(pbox[0].x, pbox[1].x);
      ON_Interval pvdom(pbox[0].y, pbox[1].y);
      // fatten up invervals to get slightly larger boxes...
      pudom.Expand(0.1 * pudom.Length());
      pvdom.Expand(0.1 * pvdom.Length());
      ON_Interval Sdom[] = { Domain(0), Domain(1) };
      // but don't let the fattened intervals extend beyond Sdom
      pudom.Intersection(Sdom[0]);
      pvdom.Intersection(Sdom[1]);
      if (pbox.IsValid() &&
        (Sdom[0].Includes(pudom, true) || Sdom[1].Includes(pvdom, true))
        )
      {
        ON_Surface* temp_srf = DuplicateSurface();
        if (nullptr != temp_srf)
        {
          if (Sdom[0].Includes(pudom, true))
            temp_srf->Trim(0, pudom);
          if (Sdom[1].Includes(pvdom, true))
            temp_srf->Trim(1, pvdom);
          if (false == temp_srf->GetBoundingBox(face_bbox, false))
            face_bbox = ON_BoundingBox::NanBoundingBox;
          delete temp_srf;
          temp_srf = nullptr;
        }
      }
    }

    if (false == face_bbox.IsNotEmpty())
    {
      if (false == proxy_srf->GetBoundingBox(face_bbox, false))
        break;
      if (false == face_bbox.IsNotEmpty())
        break;
    }

    if (bUpdateCachedBBox)
      const_cast<ON_BrepFace*>(this)->m_bbox = face_bbox;
    return face_bbox;
  }

  // ON_Brep code has always used ON_BoundingBox::EmptyBoundingBox 
  // to indicate a bounding box is not set. If it were to be written
  // in modern times, it would have used Nans.
  return ON_BoundingBox::EmptyBoundingBox;
}